

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O1

void hocfunchack(Symbol *n,Item *qpar1,Item *qpar2,int hack)

{
  int iVar1;
  Item *pIVar2;
  uint uVar3;
  char *str;
  char *pcVar4;
  
  lappendstr(procfunc,"\n#if 0 /*BBCORE*/\n");
  pcVar4 = "\nstatic double _hoc_%s(void* _vptr) {\n double _r;\n";
  if (point_process == 0) {
    pcVar4 = "\nstatic void _hoc_%s(void) {\n  double _r;\n";
  }
  sprintf(buf,pcVar4,n->name);
  lappendstr(procfunc,buf);
  pIVar2 = lappendstr(procfunc,"");
  vectorize_substitute
            (pIVar2,"  double* _p; Datum* _ppvar; ThreadDatum* _thread; NrnThread* _nt;\n");
  pcVar4 = "  _hoc_setdata(_vptr);\n";
  if (point_process == 0) {
    pcVar4 = "";
  }
  str = 
  "  _p = ((Point_process*)_vptr)->_prop->param;\n  _ppvar = ((Point_process*)_vptr)->_prop->dparam;\n  _thread = _extcall_thread;\n  _nt = (NrnThread*)((Point_process*)_vptr)->_vnt;\n"
  ;
  if (point_process == 0) {
    str = 
    "  if (_extcall_prop) {_p = _extcall_prop->param; _ppvar = _extcall_prop->dparam;}else{ _p = (double*)0; _ppvar = (Datum*)0; }\n  _thread = _extcall_thread;\n  _nt = nrn_threads;\n"
    ;
  }
  pIVar2 = lappendstr(procfunc,pcVar4);
  vectorize_substitute(pIVar2,str);
  if (last_func_using_table == n) {
    pIVar2 = lappendstr(procfunc,"");
    sprintf(buf,"\n#if 1\n _check_%s(_threadargs_);\n#endif\n",n->name);
    vectorize_substitute(pIVar2,buf);
  }
  pcVar4 = "_r = ";
  if ((n->subtype & 0x40) == 0) {
    pcVar4 = "_r = 1.;\n";
  }
  lappendstr(procfunc,pcVar4);
  lappendsym(procfunc,n);
  lappendstr(procfunc,"(");
  pIVar2 = lappendstr(procfunc,"");
  iVar1 = n->varnum;
  if (iVar1 < 1) {
    pcVar4 = ");\n return(_r);\n}\n";
    if (point_process == 0) {
      pcVar4 = ";\n hoc_retpushx(_r);\n}\n";
    }
    lappendstr(procfunc,pcVar4);
    lappendstr(procfunc,"\n#endif /*BBCORE*/\n");
  }
  else {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + 1;
      sprintf(buf,"*getarg(%d)",(ulong)uVar3);
      lappendstr(procfunc,buf);
      if ((int)uVar3 < n->varnum) {
        lappendstr(procfunc,",");
      }
    } while ((int)uVar3 < n->varnum);
    pcVar4 = ");\n return(_r);\n}\n";
    if (point_process == 0) {
      pcVar4 = ";\n hoc_retpushx(_r);\n}\n";
    }
    lappendstr(procfunc,pcVar4);
    lappendstr(procfunc,"\n#endif /*BBCORE*/\n");
    if (0 < iVar1) {
      pcVar4 = "_threadargs_,";
      goto LAB_001126a0;
    }
  }
  if (hack != 0) {
    return;
  }
  pcVar4 = "_threadargs_";
LAB_001126a0:
  vectorize_substitute(pIVar2,pcVar4);
  return;
}

Assistant:

void hocfunchack(Symbol* n, Item* qpar1, Item* qpar2, int hack)
{
#if NOCMODL
	extern int point_process;
#endif
	Item *q;
	int i;
#if VECTORIZE
	Item* qp=0;
#endif
	
#if BBCORE 
 Lappendstr(procfunc, "\n#if 0 /*BBCORE*/\n");
#endif
   if (point_process) {
	Sprintf(buf, "\nstatic double _hoc_%s(void* _vptr) {\n double _r;\n", n->name);
   }else{
	Sprintf(buf, "\nstatic void _hoc_%s(void) {\n  double _r;\n", n->name);
   }
	Lappendstr(procfunc, buf);
	vectorize_substitute(lappendstr(procfunc, ""), "\
  double* _p; Datum* _ppvar; ThreadDatum* _thread; NrnThread* _nt;\n\
");
	if (point_process) {
		vectorize_substitute(lappendstr(procfunc, "  _hoc_setdata(_vptr);\n"), "\
  _p = ((Point_process*)_vptr)->_prop->param;\n\
  _ppvar = ((Point_process*)_vptr)->_prop->dparam;\n\
  _thread = _extcall_thread;\n\
  _nt = (NrnThread*)((Point_process*)_vptr)->_vnt;\n\
");
	}else{
		vectorize_substitute(lappendstr(procfunc, ""), "\
  if (_extcall_prop) {_p = _extcall_prop->param; _ppvar = _extcall_prop->dparam;}else{ _p = (double*)0; _ppvar = (Datum*)0; }\n\
  _thread = _extcall_thread;\n\
  _nt = nrn_threads;\n\
");
	}
#if VECTORIZE
	if (n == last_func_using_table) {
		qp = lappendstr(procfunc, "");
		sprintf(buf,"\n#if 1\n _check_%s(_threadargs_);\n#endif\n", n->name);
		vectorize_substitute(qp, buf);
	}
#endif
	if (n->subtype & FUNCT) {
		Lappendstr(procfunc, "_r = ");
	}else{
		Lappendstr(procfunc, "_r = 1.;\n");
	}
	Lappendsym(procfunc, n);
	lappendstr(procfunc, "(");
#if VECTORIZE
	qp = lappendstr(procfunc, "");
#endif
	for (i=0; i < n->varnum; ++i) {
		Sprintf(buf, "*getarg(%d)", i+1);
		Lappendstr(procfunc, buf);
		if (i+1 < n->varnum) {
			Lappendstr(procfunc, ",");
		}
	}
#if NOCMODL
   if (point_process) {
	Lappendstr(procfunc, ");\n return(_r);\n}\n");
   }else
#endif
	Lappendstr(procfunc, ";\n hoc_retpushx(_r);\n}\n");
#if BBCORE 
	Lappendstr(procfunc, "\n#endif /*BBCORE*/\n");
#endif
#if VECTORIZE
	if (i) {
		vectorize_substitute(qp, "_threadargs_,");
	}else if (!hack) {
		vectorize_substitute(qp, "_threadargs_");
	}
#endif
}